

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::RemoveEntry(cmCursesMainForm *this,char *value)

{
  pointer *pppcVar1;
  cmake *this_00;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar2;
  pointer __dest;
  int iVar3;
  char *__s2;
  size_t sVar4;
  pointer __src;
  pointer ppcVar5;
  string local_50;
  
  if ((value != (char *)0x0) &&
     (ppcVar5 = (this->Entries->
                super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                )._M_impl.super__Vector_impl_data._M_start, __dest = ppcVar5,
     ppcVar5 !=
     (this->Entries->
     super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
     )._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      __src = __dest + 1;
      __s2 = cmCursesCacheEntryComposite::GetValue(*ppcVar5);
      if ((__s2 != (char *)0x0) && (iVar3 = strcmp(value,__s2), iVar3 == 0)) {
        this_00 = this->CMakeInstance;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar4 = strlen(value);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,value,value + sVar4);
        cmake::UnwatchUnusedCli(this_00,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pvVar2 = this->Entries;
        ppcVar5 = (pvVar2->
                  super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (__src != ppcVar5) {
          memmove(__dest,__src,(long)ppcVar5 - (long)__src);
        }
        pppcVar1 = &(pvVar2->
                    super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + -1;
        return;
      }
      ppcVar5 = ppcVar5 + 1;
      __dest = __src;
    } while (ppcVar5 !=
             (this->Entries->
             super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmCursesMainForm::RemoveEntry(const char* value)
{
  if (!value)
    {
    return;
    }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* val = (*it)->GetValue();
    if (  val && !strcmp(value, val) )
      {
      this->CMakeInstance->UnwatchUnusedCli(value);
      this->Entries->erase(it);
      break;
      }
    }
}